

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int whereLoopAddBtree(WhereLoopBuilder *pBuilder,Bitmask mPrereq)

{
  byte *pbVar1;
  short *psVar2;
  byte bVar3;
  byte bVar4;
  ushort uVar5;
  WhereLoop *pLoop;
  SrcList *pSVar6;
  Table *pTVar7;
  Index *pIVar8;
  UnpackedRecord *p;
  sqlite3 *db;
  u8 uVar9;
  LogEst LVar10;
  short sVar11;
  LogEst LVar12;
  int iVar13;
  u32 uVar14;
  int iVar15;
  uint uVar16;
  undefined6 extraout_var;
  Expr *pA;
  WhereTerm *pWVar17;
  int iVar18;
  long lVar19;
  Index *pIdx;
  u8 uVar20;
  ExprList_item *pEVar21;
  WhereTerm *pWVar22;
  long lVar23;
  Mem *p_00;
  ulong uVar24;
  bool bVar25;
  bool bVar26;
  i16 aiColumnPk;
  WhereInfo *local_108;
  WhereLoopBuilder *local_100;
  ExprList *local_f8;
  ulong local_f0;
  WhereClause *local_e8;
  Bitmask local_e0;
  ExprList_item *local_d8;
  LogEst aiRowEstPk [2];
  Index sPk;
  
  aiColumnPk = -1;
  pLoop = pBuilder->pNew;
  local_108 = pBuilder->pWInfo;
  local_e8 = pBuilder->pWC;
  pSVar6 = local_108->pTabList;
  bVar3 = pLoop->iTab;
  pTVar7 = pSVar6->a[bVar3].pTab;
  pIVar8 = pSVar6->a[bVar3].pIBIndex;
  pIdx = pIVar8;
  local_e0 = mPrereq;
  if (pIVar8 == (Index *)0x0) {
    if ((pTVar7->tabFlags & 0x20) == 0) {
      pIdx = &sPk;
      memset(pIdx,0,0x98);
      sPk.nKeyCol = 1;
      sPk.nColumn = 1;
      sPk.aiColumn = &aiColumnPk;
      sPk.aiRowLogEst = aiRowEstPk;
      sPk.onError = '\x05';
      sPk.szIdxRow = pTVar7->szTabRow;
      sPk._99_2_ = 3;
      aiRowEstPk[0] = pTVar7->nRowLogEst;
      aiRowEstPk[1] = 0;
      sPk.pTable = pTVar7;
      if ((pSVar6->a[bVar3].fg.field_0x1 & 1) == 0) {
        sPk.pNext = pTVar7->pIndex;
      }
    }
    else {
      pIdx = pTVar7->pIndex;
    }
  }
  uVar5 = pTVar7->nRowLogEst;
  LVar10 = estLog(uVar5);
  iVar18 = 0;
  if ((((pBuilder->pOrSet == (WhereOrSet *)0x0) && (iVar18 = 0, (local_108->wctrlFlags & 0x20) == 0)
       ) && (iVar18 = 0, (local_108->pParse->db->flags & 0x8000) != 0)) &&
     (iVar18 = 0, pIVar8 == (Index *)0x0)) {
    bVar4 = pSVar6->a[bVar3].fg.field_0x1;
    iVar18 = 0;
    if ((((bVar4 & 1) == 0) && (iVar18 = 0, (bVar4 & 0x28) == 0)) &&
       (iVar18 = 0, (pTVar7->tabFlags & 0x20) == 0)) {
      pWVar17 = local_e8->a;
      pWVar22 = pWVar17 + local_e8->nTerm;
      local_f0 = CONCAT44(local_f0._4_4_,(int)CONCAT62(extraout_var,LVar10) + (uint)uVar5 + 0x1c);
      iVar18 = 0;
      for (; (iVar18 == 0 && (pWVar17 < pWVar22)); pWVar17 = pWVar17 + 1) {
        iVar18 = 0;
        if ((pWVar17->prereqRight & pLoop->maskSelf) == 0) {
          iVar18 = 0;
          iVar13 = termCanDriveIndex(pWVar17,pSVar6->a + bVar3,0);
          if (iVar13 != 0) {
            (pLoop->u).btree.nEq = 1;
            (pLoop->u).btree.pIndex = (Index *)0x0;
            pLoop->nLTerm = 1;
            pLoop->nSkip = 0;
            *pLoop->aLTerm = pWVar17;
            if ((pTVar7->pSelect != (Select *)0x0) ||
               (sVar11 = (short)local_f0, (pTVar7->tabFlags & 2) != 0)) {
              sVar11 = LVar10 + uVar5 + -10;
            }
            LVar12 = 0;
            if (0 < sVar11) {
              LVar12 = sVar11;
            }
            pLoop->rSetup = LVar12;
            pLoop->nOut = 0x2b;
            LVar12 = sqlite3LogEstAdd(LVar10,0x2b);
            pLoop->rRun = LVar12;
            pLoop->wsFlags = 0x4000;
            pLoop->prereq = pWVar17->prereqRight | local_e0;
            iVar18 = whereLoopInsert(pBuilder,pLoop);
          }
        }
      }
    }
  }
  uVar20 = '\x01';
  local_100 = pBuilder;
LAB_0018a8e7:
  if ((iVar18 != 0) || (pIdx == (Index *)0x0)) {
    return iVar18;
  }
  if (((pIdx->pPartIdxWhere == (Expr *)0x0) ||
      (iVar18 = whereUsablePartialIndex(pSVar6->a[bVar3].iCursor,local_e8,pIdx->pPartIdxWhere),
      iVar18 != 0)) && ((pIdx->field_0x64 & 1) == 0)) {
    uVar5 = *pIdx->aiRowLogEst;
    local_f0 = (ulong)uVar5;
    (pLoop->u).vtab.idxNum = 0;
    (pLoop->u).btree.nTop = 0;
    pLoop->nLTerm = 0;
    pLoop->nSkip = 0;
    pLoop->iSortIdx = '\0';
    pLoop->rSetup = 0;
    pLoop->prereq = local_e0;
    pLoop->nOut = uVar5;
    (pLoop->u).btree.pIndex = pIdx;
    bVar25 = true;
    if (((pIdx->field_0x63 & 4) == 0) &&
       (local_f8 = pBuilder->pWInfo->pOrderBy, local_f8 != (ExprList *)0x0)) {
      iVar18 = pSVar6->a[bVar3].iCursor;
      local_d8 = local_f8->a;
      for (lVar23 = 0; bVar25 = local_f8->nExpr <= lVar23, lVar23 < local_f8->nExpr;
          lVar23 = lVar23 + 1) {
        pA = sqlite3ExprSkipCollate(local_d8[lVar23].pExpr);
        if ((pA->op == 0xa2) && (pA->iTable == iVar18)) {
          if (pA->iColumn < 0) break;
          uVar24 = 0;
          while (pIdx->nKeyCol != uVar24) {
            psVar2 = pIdx->aiColumn + uVar24;
            uVar24 = uVar24 + 1;
            if (pA->iColumn == *psVar2) goto LAB_0018aa5d;
          }
        }
        else if (pIdx->aColExpr != (ExprList *)0x0) {
          pEVar21 = pIdx->aColExpr->a;
          for (uVar24 = 0; uVar24 < pIdx->nKeyCol; uVar24 = uVar24 + 1) {
            if ((pIdx->aiColumn[uVar24] == -2) &&
               (iVar13 = sqlite3ExprCompareSkip(pA,pEVar21->pExpr,iVar18), iVar13 == 0))
            goto LAB_0018aa5d;
            pEVar21 = pEVar21 + 1;
          }
        }
        pBuilder = local_100;
      }
    }
    goto LAB_0018aa6a;
  }
  iVar18 = 0;
  goto LAB_0018aca1;
LAB_0018aa5d:
  bVar25 = false;
  pBuilder = local_100;
LAB_0018aa6a:
  LVar10 = (LogEst)local_f0;
  if ((~*(ushort *)&pIdx->field_0x63 & 3) == 0) {
    uVar9 = uVar20;
    if (bVar25) {
      uVar9 = '\0';
    }
    pLoop->wsFlags = 0x100;
    pLoop->iSortIdx = uVar9;
    pLoop->rRun = LVar10 + 0x10;
    whereLoopOutputAdjust(local_e8,pLoop,LVar10);
    iVar18 = whereLoopInsert(pBuilder,pLoop);
    pLoop->nOut = LVar10;
  }
  else {
    if ((*(ushort *)&pIdx->field_0x63 & 0x20) == 0) {
      bVar26 = (pSVar6->a[bVar3].colUsed & pIdx->colNotIdxed) == 0;
      uVar14 = (bVar26 | 8) << 6;
    }
    else {
      bVar26 = true;
      uVar14 = 0x240;
    }
    pLoop->wsFlags = uVar14;
    uVar9 = uVar20;
    if ((((bVar25) && (uVar9 = '\0', (pTVar7->tabFlags & 0x20) == 0)) &&
        (pIdx->pPartIdxWhere == (Expr *)0x0)) &&
       ((((!bVar26 || ((pIdx->field_0x63 & 4) != 0)) ||
         ((pTVar7->szTabRow <= pIdx->szIdxRow ||
          (((local_108->wctrlFlags & 4) != 0 || (sqlite3Config.bUseCis == 0)))))) ||
        ((local_108->pParse->db->dbOptFlags & 0x20) != 0)))) goto LAB_0018ac14;
    pLoop->iSortIdx = uVar9;
    pLoop->rRun = (short)((pIdx->szIdxRow * 0xf) / (int)pTVar7->szTabRow) + LVar10 + 1;
    if (!bVar26) {
      local_f8 = (ExprList *)CONCAT44(local_f8._4_4_,(int)LVar10);
      iVar13 = (int)local_f0 + 0x10;
      iVar18 = pSVar6->a[bVar3].iCursor;
      lVar23 = 0x14;
      for (lVar19 = 0; lVar19 < (local_108->sWC).nTerm; lVar19 = lVar19 + 1) {
        pWVar17 = (local_108->sWC).a;
        iVar15 = sqlite3ExprCoveredByIndex(*(Expr **)((long)pWVar17 + lVar23 + -0x14),iVar18,pIdx);
        if (iVar15 == 0) break;
        uVar5 = *(ushort *)((long)pWVar17 + lVar23 + -4);
        uVar16 = (uint)uVar5;
        if (0 < (short)uVar5) {
          uVar16 = -(uint)((*(byte *)((long)&pWVar17->pExpr + lVar23) & 0x82) == 0) | 0xffec;
        }
        iVar13 = uVar16 + iVar13;
        lVar23 = lVar23 + 0x40;
      }
      LVar10 = sqlite3LogEstAdd(pLoop->rRun,(LogEst)iVar13);
      pLoop->rRun = LVar10;
      LVar10 = (LogEst)local_f8;
      pBuilder = local_100;
    }
    uVar24 = local_f0;
    whereLoopOutputAdjust(local_e8,pLoop,LVar10);
    iVar18 = whereLoopInsert(pBuilder,pLoop);
    pLoop->nOut = (LogEst)uVar24;
  }
  if (iVar18 != 0) {
    return iVar18;
  }
LAB_0018ac14:
  pBuilder->bldFlags = 0;
  iVar18 = whereLoopAddBtreeIndex(pBuilder,pSVar6->a + bVar3,pIdx,0);
  if (pBuilder->bldFlags == 1) {
    pbVar1 = (byte *)((long)&pTVar7->tabFlags + 1);
    *pbVar1 = *pbVar1 | 1;
  }
  p = pBuilder->pRec;
  if (p != (UnpackedRecord *)0x0) {
    p_00 = p->aMem;
    uVar24 = (ulong)p->pKeyInfo->nAllField;
    db = p_00->db;
    while (bVar25 = uVar24 != 0, uVar24 = uVar24 - 1, bVar25) {
      sqlite3VdbeMemRelease(p_00);
      p_00 = p_00 + 1;
    }
    sqlite3KeyInfoUnref(p->pKeyInfo);
    sqlite3DbFreeNN(db,p);
    pBuilder = local_100;
  }
  pBuilder->nRecValid = 0;
  pBuilder->pRec = (UnpackedRecord *)0x0;
LAB_0018aca1:
  if (pSVar6->a[bVar3].pIBIndex == (Index *)0x0) {
    pIdx = pIdx->pNext;
  }
  else {
    pIdx = (Index *)0x0;
  }
  uVar20 = uVar20 + '\x01';
  goto LAB_0018a8e7;
}

Assistant:

static int whereLoopAddBtree(
  WhereLoopBuilder *pBuilder, /* WHERE clause information */
  Bitmask mPrereq             /* Extra prerequesites for using this table */
){
  WhereInfo *pWInfo;          /* WHERE analysis context */
  Index *pProbe;              /* An index we are evaluating */
  Index sPk;                  /* A fake index object for the primary key */
  LogEst aiRowEstPk[2];       /* The aiRowLogEst[] value for the sPk index */
  i16 aiColumnPk = -1;        /* The aColumn[] value for the sPk index */
  SrcList *pTabList;          /* The FROM clause */
  struct SrcList_item *pSrc;  /* The FROM clause btree term to add */
  WhereLoop *pNew;            /* Template WhereLoop object */
  int rc = SQLITE_OK;         /* Return code */
  int iSortIdx = 1;           /* Index number */
  int b;                      /* A boolean value */
  LogEst rSize;               /* number of rows in the table */
  LogEst rLogSize;            /* Logarithm of the number of rows in the table */
  WhereClause *pWC;           /* The parsed WHERE clause */
  Table *pTab;                /* Table being queried */
  
  pNew = pBuilder->pNew;
  pWInfo = pBuilder->pWInfo;
  pTabList = pWInfo->pTabList;
  pSrc = pTabList->a + pNew->iTab;
  pTab = pSrc->pTab;
  pWC = pBuilder->pWC;
  assert( !IsVirtual(pSrc->pTab) );

  if( pSrc->pIBIndex ){
    /* An INDEXED BY clause specifies a particular index to use */
    pProbe = pSrc->pIBIndex;
  }else if( !HasRowid(pTab) ){
    pProbe = pTab->pIndex;
  }else{
    /* There is no INDEXED BY clause.  Create a fake Index object in local
    ** variable sPk to represent the rowid primary key index.  Make this
    ** fake index the first in a chain of Index objects with all of the real
    ** indices to follow */
    Index *pFirst;                  /* First of real indices on the table */
    memset(&sPk, 0, sizeof(Index));
    sPk.nKeyCol = 1;
    sPk.nColumn = 1;
    sPk.aiColumn = &aiColumnPk;
    sPk.aiRowLogEst = aiRowEstPk;
    sPk.onError = OE_Replace;
    sPk.pTable = pTab;
    sPk.szIdxRow = pTab->szTabRow;
    sPk.idxType = SQLITE_IDXTYPE_IPK;
    aiRowEstPk[0] = pTab->nRowLogEst;
    aiRowEstPk[1] = 0;
    pFirst = pSrc->pTab->pIndex;
    if( pSrc->fg.notIndexed==0 ){
      /* The real indices of the table are only considered if the
      ** NOT INDEXED qualifier is omitted from the FROM clause */
      sPk.pNext = pFirst;
    }
    pProbe = &sPk;
  }
  rSize = pTab->nRowLogEst;
  rLogSize = estLog(rSize);

#ifndef SQLITE_OMIT_AUTOMATIC_INDEX
  /* Automatic indexes */
  if( !pBuilder->pOrSet      /* Not part of an OR optimization */
   && (pWInfo->wctrlFlags & WHERE_OR_SUBCLAUSE)==0
   && (pWInfo->pParse->db->flags & SQLITE_AutoIndex)!=0
   && pSrc->pIBIndex==0      /* Has no INDEXED BY clause */
   && !pSrc->fg.notIndexed   /* Has no NOT INDEXED clause */
   && HasRowid(pTab)         /* Not WITHOUT ROWID table. (FIXME: Why not?) */
   && !pSrc->fg.isCorrelated /* Not a correlated subquery */
   && !pSrc->fg.isRecursive  /* Not a recursive common table expression. */
  ){
    /* Generate auto-index WhereLoops */
    WhereTerm *pTerm;
    WhereTerm *pWCEnd = pWC->a + pWC->nTerm;
    for(pTerm=pWC->a; rc==SQLITE_OK && pTerm<pWCEnd; pTerm++){
      if( pTerm->prereqRight & pNew->maskSelf ) continue;
      if( termCanDriveIndex(pTerm, pSrc, 0) ){
        pNew->u.btree.nEq = 1;
        pNew->nSkip = 0;
        pNew->u.btree.pIndex = 0;
        pNew->nLTerm = 1;
        pNew->aLTerm[0] = pTerm;
        /* TUNING: One-time cost for computing the automatic index is
        ** estimated to be X*N*log2(N) where N is the number of rows in
        ** the table being indexed and where X is 7 (LogEst=28) for normal
        ** tables or 0.5 (LogEst=-10) for views and subqueries.  The value
        ** of X is smaller for views and subqueries so that the query planner
        ** will be more aggressive about generating automatic indexes for
        ** those objects, since there is no opportunity to add schema
        ** indexes on subqueries and views. */
        pNew->rSetup = rLogSize + rSize;
        if( pTab->pSelect==0 && (pTab->tabFlags & TF_Ephemeral)==0 ){
          pNew->rSetup += 28;
        }else{
          pNew->rSetup -= 10;
        }
        ApplyCostMultiplier(pNew->rSetup, pTab->costMult);
        if( pNew->rSetup<0 ) pNew->rSetup = 0;
        /* TUNING: Each index lookup yields 20 rows in the table.  This
        ** is more than the usual guess of 10 rows, since we have no way
        ** of knowing how selective the index will ultimately be.  It would
        ** not be unreasonable to make this value much larger. */
        pNew->nOut = 43;  assert( 43==sqlite3LogEst(20) );
        pNew->rRun = sqlite3LogEstAdd(rLogSize,pNew->nOut);
        pNew->wsFlags = WHERE_AUTO_INDEX;
        pNew->prereq = mPrereq | pTerm->prereqRight;
        rc = whereLoopInsert(pBuilder, pNew);
      }
    }
  }
#endif /* SQLITE_OMIT_AUTOMATIC_INDEX */

  /* Loop over all indices. If there was an INDEXED BY clause, then only 
  ** consider index pProbe.  */
  for(; rc==SQLITE_OK && pProbe; 
      pProbe=(pSrc->pIBIndex ? 0 : pProbe->pNext), iSortIdx++
  ){
    if( pProbe->pPartIdxWhere!=0
     && !whereUsablePartialIndex(pSrc->iCursor, pWC, pProbe->pPartIdxWhere) ){
      testcase( pNew->iTab!=pSrc->iCursor );  /* See ticket [98d973b8f5] */
      continue;  /* Partial index inappropriate for this query */
    }
    if( pProbe->bNoQuery ) continue;
    rSize = pProbe->aiRowLogEst[0];
    pNew->u.btree.nEq = 0;
    pNew->u.btree.nBtm = 0;
    pNew->u.btree.nTop = 0;
    pNew->nSkip = 0;
    pNew->nLTerm = 0;
    pNew->iSortIdx = 0;
    pNew->rSetup = 0;
    pNew->prereq = mPrereq;
    pNew->nOut = rSize;
    pNew->u.btree.pIndex = pProbe;
    b = indexMightHelpWithOrderBy(pBuilder, pProbe, pSrc->iCursor);
    /* The ONEPASS_DESIRED flags never occurs together with ORDER BY */
    assert( (pWInfo->wctrlFlags & WHERE_ONEPASS_DESIRED)==0 || b==0 );
    if( pProbe->idxType==SQLITE_IDXTYPE_IPK ){
      /* Integer primary key index */
      pNew->wsFlags = WHERE_IPK;

      /* Full table scan */
      pNew->iSortIdx = b ? iSortIdx : 0;
      /* TUNING: Cost of full table scan is (N*3.0). */
      pNew->rRun = rSize + 16;
      ApplyCostMultiplier(pNew->rRun, pTab->costMult);
      whereLoopOutputAdjust(pWC, pNew, rSize);
      rc = whereLoopInsert(pBuilder, pNew);
      pNew->nOut = rSize;
      if( rc ) break;
    }else{
      Bitmask m;
      if( pProbe->isCovering ){
        pNew->wsFlags = WHERE_IDX_ONLY | WHERE_INDEXED;
        m = 0;
      }else{
        m = pSrc->colUsed & pProbe->colNotIdxed;
        pNew->wsFlags = (m==0) ? (WHERE_IDX_ONLY|WHERE_INDEXED) : WHERE_INDEXED;
      }

      /* Full scan via index */
      if( b
       || !HasRowid(pTab)
       || pProbe->pPartIdxWhere!=0
       || ( m==0
         && pProbe->bUnordered==0
         && (pProbe->szIdxRow<pTab->szTabRow)
         && (pWInfo->wctrlFlags & WHERE_ONEPASS_DESIRED)==0
         && sqlite3GlobalConfig.bUseCis
         && OptimizationEnabled(pWInfo->pParse->db, SQLITE_CoverIdxScan)
          )
      ){
        pNew->iSortIdx = b ? iSortIdx : 0;

        /* The cost of visiting the index rows is N*K, where K is
        ** between 1.1 and 3.0, depending on the relative sizes of the
        ** index and table rows. */
        pNew->rRun = rSize + 1 + (15*pProbe->szIdxRow)/pTab->szTabRow;
        if( m!=0 ){
          /* If this is a non-covering index scan, add in the cost of
          ** doing table lookups.  The cost will be 3x the number of
          ** lookups.  Take into account WHERE clause terms that can be
          ** satisfied using just the index, and that do not require a
          ** table lookup. */
          LogEst nLookup = rSize + 16;  /* Base cost:  N*3 */
          int ii;
          int iCur = pSrc->iCursor;
          WhereClause *pWC2 = &pWInfo->sWC;
          for(ii=0; ii<pWC2->nTerm; ii++){
            WhereTerm *pTerm = &pWC2->a[ii];
            if( !sqlite3ExprCoveredByIndex(pTerm->pExpr, iCur, pProbe) ){
              break;
            }
            /* pTerm can be evaluated using just the index.  So reduce
            ** the expected number of table lookups accordingly */
            if( pTerm->truthProb<=0 ){
              nLookup += pTerm->truthProb;
            }else{
              nLookup--;
              if( pTerm->eOperator & (WO_EQ|WO_IS) ) nLookup -= 19;
            }
          }
          
          pNew->rRun = sqlite3LogEstAdd(pNew->rRun, nLookup);
        }
        ApplyCostMultiplier(pNew->rRun, pTab->costMult);
        whereLoopOutputAdjust(pWC, pNew, rSize);
        rc = whereLoopInsert(pBuilder, pNew);
        pNew->nOut = rSize;
        if( rc ) break;
      }
    }

    pBuilder->bldFlags = 0;
    rc = whereLoopAddBtreeIndex(pBuilder, pSrc, pProbe, 0);
    if( pBuilder->bldFlags==SQLITE_BLDF_INDEXED ){
      /* If a non-unique index is used, or if a prefix of the key for
      ** unique index is used (making the index functionally non-unique)
      ** then the sqlite_stat1 data becomes important for scoring the
      ** plan */
      pTab->tabFlags |= TF_StatsUsed;
    }
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
    sqlite3Stat4ProbeFree(pBuilder->pRec);
    pBuilder->nRecValid = 0;
    pBuilder->pRec = 0;
#endif
  }
  return rc;
}